

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::shuffleExports(TranslateToFuzzReader *this)

{
  pointer puVar1;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  if (((this->wasm->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->wasm->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (this->preserveImportsAndExports == false)) {
    uVar3 = Random::upTo(&this->random,2);
    if (uVar3 != 0) {
      lVar5 = (long)(this->wasm->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->wasm->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar5 != 8) {
        lVar5 = lVar5 >> 3;
        iVar7 = 0;
        uVar6 = 0;
        do {
          uVar3 = Random::upTo(&this->random,(int)lVar5 + iVar7);
          if (uVar3 != 0) {
            uVar4 = uVar3 + (int)uVar6;
            puVar1 = (this->wasm->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar2._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
            super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = puVar1[uVar6]._M_t;
            puVar1[uVar6]._M_t =
                 (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)
                 puVar1[uVar4]._M_t;
            puVar1[uVar4]._M_t =
                 uVar2._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          lVar5 = (long)(this->wasm->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->wasm->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          iVar7 = iVar7 + -1;
        } while (uVar6 < lVar5 - 1U);
      }
      wasm::Module::updateMaps();
      return;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::shuffleExports() {
  // Randomly ordering the exports is useful for a few reasons. First, initial
  // content may have a natural order in which to execute things (an "init"
  // export first, for example), and changing that order may lead to very
  // different execution. Second, even in the fuzzer's own random content there
  // is a "direction", since we generate as we go (e.g. no function calls a
  // later function that does not exist yet / will be created later), and also
  // we emit invokes for a function right after it (so we end up calling the
  // same code several times in succession, but interleaving it with others may
  // find more things). But we also keep a good chance for the natural order
  // here, as it may help some initial content. Note we cannot do this if we are
  // preserving the exports, as their order is something we must maintain.
  if (wasm.exports.empty() || preserveImportsAndExports || oneIn(2)) {
    return;
  }

  // Sort the exports in the simple Fisher-Yates manner.
  // https://en.wikipedia.org/wiki/Fisher%E2%80%93Yates_shuffle#The_modern_algorithm
  for (Index i = 0; i < wasm.exports.size() - 1; i++) {
    // Pick the index of the item to place at index |i|. The number of items to
    // pick from begins at the full length, then decreases with i.
    auto j = i + upTo(wasm.exports.size() - i);

    // Swap the item over here.
    if (j != i) {
      std::swap(wasm.exports[i], wasm.exports[j]);
    }
  }

  wasm.updateMaps();
}